

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::PopTextWrapPos(void)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  uint uVar3;
  float fVar4;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->Accessed = true;
  iVar1 = (pIVar2->DC).TextWrapPosStack.Size;
  if (0 < iVar1) {
    uVar3 = iVar1 - 1;
    (pIVar2->DC).TextWrapPosStack.Size = uVar3;
    if (uVar3 == 0) {
      fVar4 = -1.0;
    }
    else {
      fVar4 = (pIVar2->DC).TextWrapPosStack.Data[(ulong)uVar3 - 1];
    }
    (pIVar2->DC).TextWrapPos = fVar4;
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                ,0x378,"void ImVector<float>::pop_back() [T = float]");
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->Accessed = true; return g.CurrentWindow; }